

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signet.cpp
# Opt level: O2

bool CheckSignetBlockSolution(CBlock *block,Params *consensusParams)

{
  CTransaction *txTo;
  long lVar1;
  bool bVar2;
  bool bVar3;
  CScript *scriptPubKey;
  optional<SignetTxs> *__return_storage_ptr__;
  CScript *scriptSig;
  long in_FS_OFFSET;
  initializer_list<CTxOut> __l;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  allocator_type local_2c9;
  vector<CTxOut,_std::allocator<CTxOut>_> local_2c8;
  TransactionSignatureChecker sigcheck;
  PrecomputedTransactionData txdata;
  optional<SignetTxs> signet_txs;
  CScript challenge;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CBlockHeader::GetHash(&txdata.m_prevouts_single_hash,&block->super_CBlockHeader);
  bVar2 = operator==((base_blob<256U> *)&txdata,(base_blob<256U> *)consensusParams);
  bVar3 = true;
  if (!bVar2) {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::
    prevector<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              (&challenge.super_CScriptBase,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(consensusParams->signet_challenge).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(consensusParams->signet_challenge).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    __return_storage_ptr__ = &signet_txs;
    SignetTxs::Create(__return_storage_ptr__,block,(CScript *)&challenge.super_CScriptBase);
    if (signet_txs.super__Optional_base<SignetTxs,_false,_false>._M_payload.
        super__Optional_payload<SignetTxs,_true,_false,_false>.
        super__Optional_payload_base<SignetTxs>._M_engaged == false) {
      bVar2 = LogAcceptCategory((LogFlags)__return_storage_ptr__,(Level)block);
      if (bVar2) {
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/signet.cpp"
        ;
        source_file_00._M_len = 0x5a;
        logging_function_00._M_str = "CheckSignetBlockSolution";
        logging_function_00._M_len = 0x18;
        LogPrintFormatInternal<>
                  (logging_function_00,source_file_00,0x88,VALIDATION,Debug,
                   (ConstevalFormatString<0U>)0xcce338);
      }
      bVar3 = false;
    }
    else {
      memset(&txdata,0,0x102);
      txdata.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      txdata.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = 0;
      txdata.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_finish._1_7_ = 0;
      txdata.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      txdata._281_8_ = 0;
      CTxOut::CTxOut((CTxOut *)&sigcheck,
                     signet_txs.super__Optional_base<SignetTxs,_false,_false>._M_payload.
                     super__Optional_payload<SignetTxs,_true,_false,_false>.
                     super__Optional_payload_base<SignetTxs>._M_payload._M_value.m_to_spend.vout.
                     super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_start);
      __l._M_len = 1;
      __l._M_array = (iterator)&sigcheck;
      std::vector<CTxOut,_std::allocator<CTxOut>_>::vector(&local_2c8,__l,&local_2c9);
      txTo = &signet_txs.super__Optional_base<SignetTxs,_false,_false>._M_payload.
              super__Optional_payload<SignetTxs,_true,_false,_false>.
              super__Optional_payload_base<SignetTxs>._M_payload._M_value.m_to_sign;
      PrecomputedTransactionData::Init<CTransaction>(&txdata,txTo,&local_2c8,false);
      scriptSig = &(signet_txs.super__Optional_base<SignetTxs,_false,_false>._M_payload.
                    super__Optional_payload<SignetTxs,_true,_false,_false>.
                    super__Optional_payload_base<SignetTxs>._M_payload._M_value.m_to_sign.vin.
                    super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start)->scriptSig;
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_2c8);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&sigcheck.txTo);
      sigcheck.super_BaseSignatureChecker._vptr_BaseSignatureChecker =
           (_func_int **)&PTR_CheckECDSASignature_0113e8f0;
      sigcheck.m_mdb = ASSERT_FAIL;
      sigcheck.nIn = 0;
      sigcheck.amount =
           (signet_txs.super__Optional_base<SignetTxs,_false,_false>._M_payload.
            super__Optional_payload<SignetTxs,_true,_false,_false>.
            super__Optional_payload_base<SignetTxs>._M_payload._M_value.m_to_spend.vout.
            super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
           _M_start)->nValue;
      scriptPubKey = &(signet_txs.super__Optional_base<SignetTxs,_false,_false>._M_payload.
                       super__Optional_payload<SignetTxs,_true,_false,_false>.
                       super__Optional_payload_base<SignetTxs>._M_payload._M_value.m_to_spend.vout.
                       super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                       super__Vector_impl_data._M_start)->scriptPubKey;
      sigcheck.txTo = txTo;
      sigcheck.txdata = &txdata;
      bVar3 = VerifyScript(scriptSig,scriptPubKey,
                           &(signet_txs.super__Optional_base<SignetTxs,_false,_false>._M_payload.
                             super__Optional_payload<SignetTxs,_true,_false,_false>.
                             super__Optional_payload_base<SignetTxs>._M_payload._M_value.m_to_sign.
                             vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                             super__Vector_impl_data._M_start)->scriptWitness,0x815,
                           &sigcheck.super_BaseSignatureChecker,(ScriptError *)0x0);
      if (!bVar3) {
        bVar2 = LogAcceptCategory((LogFlags)scriptSig,(Level)scriptPubKey);
        if (bVar2) {
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/signet.cpp"
          ;
          source_file._M_len = 0x5a;
          logging_function._M_str = "CheckSignetBlockSolution";
          logging_function._M_len = 0x18;
          LogPrintFormatInternal<>
                    (logging_function,source_file,0x94,VALIDATION,Debug,
                     (ConstevalFormatString<0U>)0xcce382);
        }
      }
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&txdata.m_spent_outputs);
    }
    std::_Optional_payload_base<SignetTxs>::_M_reset
              ((_Optional_payload_base<SignetTxs> *)&signet_txs);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&challenge.super_CScriptBase);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool CheckSignetBlockSolution(const CBlock& block, const Consensus::Params& consensusParams)
{
    if (block.GetHash() == consensusParams.hashGenesisBlock) {
        // genesis block solution is always valid
        return true;
    }

    const CScript challenge(consensusParams.signet_challenge.begin(), consensusParams.signet_challenge.end());
    const std::optional<SignetTxs> signet_txs = SignetTxs::Create(block, challenge);

    if (!signet_txs) {
        LogDebug(BCLog::VALIDATION, "CheckSignetBlockSolution: Errors in block (block solution parse failure)\n");
        return false;
    }

    const CScript& scriptSig = signet_txs->m_to_sign.vin[0].scriptSig;
    const CScriptWitness& witness = signet_txs->m_to_sign.vin[0].scriptWitness;

    PrecomputedTransactionData txdata;
    txdata.Init(signet_txs->m_to_sign, {signet_txs->m_to_spend.vout[0]});
    TransactionSignatureChecker sigcheck(&signet_txs->m_to_sign, /* nInIn= */ 0, /* amountIn= */ signet_txs->m_to_spend.vout[0].nValue, txdata, MissingDataBehavior::ASSERT_FAIL);

    if (!VerifyScript(scriptSig, signet_txs->m_to_spend.vout[0].scriptPubKey, &witness, BLOCK_SCRIPT_VERIFY_FLAGS, sigcheck)) {
        LogDebug(BCLog::VALIDATION, "CheckSignetBlockSolution: Errors in block (block solution invalid)\n");
        return false;
    }
    return true;
}